

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_check_pubkey(mbedtls_rsa_context *ctx)

{
  mbedtls_mpi *X;
  mbedtls_mpi_uint *pmVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  
  pmVar1 = (ctx->N).p;
  iVar5 = -0x4200;
  if ((((pmVar1 != (mbedtls_mpi_uint *)0x0) &&
       (pmVar2 = (ctx->E).p, pmVar2 != (mbedtls_mpi_uint *)0x0)) && ((*pmVar1 & 1) != 0)) &&
     ((*pmVar2 & 1) != 0)) {
    X = &ctx->N;
    sVar4 = mbedtls_mpi_bitlen(X);
    if (0x7f < sVar4) {
      sVar4 = mbedtls_mpi_bitlen(X);
      if (sVar4 < 0x2001) {
        sVar4 = mbedtls_mpi_bitlen(&ctx->E);
        if (1 < sVar4) {
          iVar3 = mbedtls_mpi_cmp_mpi(&ctx->E,X);
          iVar5 = -0x4200;
          if (iVar3 < 0) {
            iVar5 = 0;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int mbedtls_rsa_check_pubkey( const mbedtls_rsa_context *ctx )
{
    if( !ctx->N.p || !ctx->E.p )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    if( ( ctx->N.p[0] & 1 ) == 0 ||
        ( ctx->E.p[0] & 1 ) == 0 )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    if( mbedtls_mpi_bitlen( &ctx->N ) < 128 ||
        mbedtls_mpi_bitlen( &ctx->N ) > MBEDTLS_MPI_MAX_BITS )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    if( mbedtls_mpi_bitlen( &ctx->E ) < 2 ||
        mbedtls_mpi_cmp_mpi( &ctx->E, &ctx->N ) >= 0 )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    return( 0 );
}